

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull)

{
  byte bVar1;
  short sVar2;
  u32 uVar3;
  Select *pSVar4;
  SrcList *pSVar5;
  Expr *pEVar6;
  Table *pTab;
  sqlite3 *db;
  Index *pIdx;
  int iVar7;
  uint uVar8;
  int iVar9;
  int addr;
  Vdbe *p;
  long lVar10;
  CollSeq *pCVar11;
  CollSeq *pCVar12;
  uint isRowid;
  int iVar13;
  Index **ppIVar14;
  int iVar15;
  
  iVar13 = pParse->nTab;
  pParse->nTab = iVar13 + 1;
  p = sqlite3GetVdbe(pParse);
  if ((((((((pX->flags & 0x800) == 0) ||
          (pSVar4 = (pX->x).pSelect, pSVar4 == (Select *)0x0 || pParse->nErr != 0)) ||
         (pSVar4->pPrior != (Select *)0x0)) ||
        (((pSVar4->selFlags & 5) != 0 || (pSVar4->pLimit != (Expr *)0x0)))) ||
       ((pSVar4->pWhere != (Expr *)0x0 ||
        ((pSVar5 = pSVar4->pSrc, pSVar5->nSrc != 1 || (pSVar5->a[0].pSelect != (Select *)0x0))))))
      || (pTab = pSVar5->a[0].pTab, pTab == (Table *)0x0)) ||
     ((((pTab->tabFlags & 0x10) != 0 || (pSVar4->pEList->nExpr != 1)) ||
      (pEVar6 = pSVar4->pEList->a->pExpr, pEVar6->op != 0x9a)))) {
LAB_0014d58b:
    if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
      pEVar6 = pX->pLeft;
      pX->pLeft = (Expr *)0x0;
      iVar7 = sqlite3ExprIsConstant(pX);
      pX->pLeft = pEVar6;
      iVar15 = 5;
      if ((iVar7 == 0) || (((pX->x).pList)->nExpr < 3)) goto LAB_0014d5bd;
    }
    uVar3 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      iVar15 = 2;
      isRowid = 0;
      if (prRhsHasNull == (int *)0x0) {
        iVar13 = 0;
      }
      else {
        iVar13 = pParse->nMem + 1;
        pParse->nMem = iVar13;
        *prRhsHasNull = iVar13;
        isRowid = 0;
      }
    }
    else {
      pParse->nQueryLoop = 0;
      iVar13 = 0;
      if (pX->pLeft->iColumn < 0) {
        uVar8 = pX->flags & 0x800;
        isRowid = uVar8 >> 0xb ^ 1;
        iVar15 = 2 - (uint)(uVar8 == 0);
      }
      else {
        iVar15 = 2;
        isRowid = 0;
      }
    }
    sqlite3CodeSubselect(pParse,pX,iVar13,isRowid);
    pParse->nQueryLoop = uVar3;
  }
  else {
    db = pParse->db;
    sVar2 = pEVar6->iColumn;
    lVar10 = (long)sVar2;
    iVar15 = sqlite3SchemaToIndex(db,pTab->pSchema);
    iVar7 = (int)(short)iVar15;
    sqlite3CodeVerifySchema(pParse,iVar7);
    iVar15 = 0;
    sqlite3TableLock(pParse,iVar7,pTab->tnum,'\0',pTab->zName);
    if (lVar10 < 0) {
      iVar15 = sqlite3CodeOnce(pParse);
      sqlite3OpenTable(pParse,iVar13,iVar7,pTab,0x36);
      sqlite3VdbeJumpHere(p,iVar15);
      iVar15 = 1;
    }
    else {
      pCVar11 = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pEVar6);
      iVar9 = sqlite3IndexAffinityOk(pX,pTab->aCol[lVar10].affinity);
      ppIVar14 = &pTab->pIndex;
      while (((pIdx = *ppIVar14, pIdx != (Index *)0x0 && (iVar15 == 0)) && (iVar9 != 0))) {
        iVar15 = 0;
        if (*pIdx->aiColumn == sVar2) {
          iVar15 = 0;
          pCVar12 = sqlite3FindCollSeq(db,db->enc,*pIdx->azColl,0);
          if ((pCVar12 == pCVar11) &&
             (((inFlags & 4) == 0 || ((pIdx->nKeyCol == 1 && (pIdx->onError != '\0')))))) {
            addr = sqlite3CodeOnce(pParse);
            sqlite3VdbeAddOp3(p,0x36,iVar13,pIdx->tnum,iVar7);
            sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
            bVar1 = *pIdx->aSortOrder;
            if ((prRhsHasNull != (int *)0x0) && (pTab->aCol[lVar10].notNull == '\0')) {
              iVar15 = pParse->nMem + 1;
              pParse->nMem = iVar15;
              *prRhsHasNull = iVar15;
              sqlite3SetHasNullFlag(p,iVar13,iVar15);
            }
            iVar15 = bVar1 + 3;
            sqlite3VdbeJumpHere(p,addr);
          }
        }
        ppIVar14 = &pIdx->pNext;
      }
      if (iVar15 == 0) goto LAB_0014d58b;
    }
LAB_0014d5bd:
    pX->iTable = iVar13;
  }
  return iVar15;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(Parse *pParse, Expr *pX, u32 inFlags, int *prRhsHasNull){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.
  */
  p = (ExprHasProperty(pX, EP_xIsSelect) ? pX->x.pSelect : 0);
  if( ALWAYS(pParse->nErr==0) && isCandidateForInOpt(p) ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    Expr *pExpr;                           /* Expression <column> */
    i16 iCol;                              /* Index of column <column> */
    i16 iDb;                               /* Database idx for pTab */

    assert( p );                        /* Because of isCandidateForInOpt(p) */
    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;
    pExpr = p->pEList->a[0].pExpr;
    iCol = (i16)pExpr->iColumn;
   
    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    /* This function is only called from two places. In both cases the vdbe
    ** has already been allocated. So assume sqlite3GetVdbe() is always
    ** successful here.
    */
    assert(v);
    if( iCol<0 ){
      int iAddr = sqlite3CodeOnce(pParse);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */

      /* The collation sequence used by the comparison. If an index is to
      ** be used in place of a temp-table, it must be ordered according
      ** to this collation sequence.  */
      CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pExpr);

      /* Check that the affinity that will be used to perform the 
      ** comparison is the same as the affinity of the column. If
      ** it is not, it is not possible to use any index.
      */
      int affinity_ok = sqlite3IndexAffinityOk(pX, pTab->aCol[iCol].affinity);

      for(pIdx=pTab->pIndex; pIdx && eType==0 && affinity_ok; pIdx=pIdx->pNext){
        if( (pIdx->aiColumn[0]==iCol)
         && sqlite3FindCollSeq(db, ENC(db), pIdx->azColl[0], 0)==pReq
         && (!mustBeUnique || (pIdx->nKeyCol==1 && IsUniqueIndex(pIdx)))
        ){
          int iAddr = sqlite3CodeOnce(pParse); VdbeCoverage(v);
          sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
          VdbeComment((v, "%s", pIdx->zName));
          assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
          eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

          if( prRhsHasNull && !pTab->aCol[iCol].notNull ){
            *prRhsHasNull = ++pParse->nMem;
            sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
          }
          sqlite3VdbeJumpHere(v, iAddr);
        }
      }
    }
  }

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not contant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }
     

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }
  return eType;
}